

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O0

void * isotree_deserialize_from_file(FILE *serialized_model,int nthreads)

{
  ostream *this;
  long in_RDI;
  exception *e;
  __single_object out;
  undefined4 in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  FILE *in_stack_fffffffffffffdf8;
  IsolationForest *in_stack_fffffffffffffe08;
  pointer local_8;
  
  if (in_RDI == 0) {
    this = std::operator<<((ostream *)&std::cerr,
                           "Passed invalid file handle to \'isotree_deserialize_from_file\'.");
    std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
    local_8 = (pointer)0x0;
  }
  else {
    isotree::IsolationForest::deserialize(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
    std::make_unique<isotree::IsolationForest,isotree::IsolationForest>(in_stack_fffffffffffffe08);
    isotree::IsolationForest::~IsolationForest
              ((IsolationForest *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    local_8 = std::
              unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>::
              release((unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                       *)0x63717a);
    std::unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>::
    ~unique_ptr((unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  }
  return local_8;
}

Assistant:

ISOTREE_EXPORTED
void* isotree_deserialize_from_file(FILE *serialized_model, int nthreads)
{
    if (!serialized_model) {
        cerr << "Passed invalid file handle to 'isotree_deserialize_from_file'." << std::endl;
        return nullptr;
    }

    try
    {
        #if __cplusplus >= 201402L
        auto out = std::make_unique<IsolationForest>(IsolationForest::deserialize(serialized_model, nthreads));
        #else
        std::unique_ptr<IsolationForest> out(new IsolationForest(std::forward<IsolationForest>(
            IsolationForest::deserialize(serialized_model, nthreads)
        )));
        #endif
        return (void*)out.release();
    }

    catch (std::exception &e)
    {
        cerr << e.what();
        cerr.flush();
        return nullptr;
    }
}